

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool __thiscall testing::UnitTest::Failed(UnitTest *this)

{
  bool bVar1;
  
  bVar1 = internal::UnitTestImpl::Failed(this->impl_);
  return bVar1;
}

Assistant:

bool UnitTest::Failed() const { return impl()->Failed(); }